

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.cpp
# Opt level: O3

void __thiscall BVFixed::Dump(BVFixed *this)

{
  bool hasBits;
  BVIndex BVar1;
  ulong uVar2;
  BVIndex base;
  BVFixed *this_00;
  
  base = 0;
  Output::Print(L"[  ");
  WordCount(this->len);
  this_00 = this + 1;
  uVar2 = 0;
  hasBits = false;
  do {
    hasBits = BVUnitT<unsigned_long>::Dump((BVUnitT<unsigned_long> *)this_00,base,hasBits);
    uVar2 = uVar2 + 1;
    BVar1 = WordCount(this->len);
    base = base + 0x40;
    this_00 = this_00 + 1;
  } while (uVar2 < BVar1);
  Output::Print(L"]\n");
  return;
}

Assistant:

void
BVFixed::Dump() const
{
    bool hasBits = false;
    Output::Print(_u("[  "));
    for(BVIndex i=0; i < this->WordCount(); i++)
    {
        hasBits = this->data[i].Dump(i * BVUnit::BitsPerWord, hasBits);
    }
    Output::Print(_u("]\n"));
}